

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_utl.cc
# Opt level: O2

CRYPTO_refcount_t * asn1_get_references(ASN1_VALUE **pval,ASN1_ITEM *it)

{
  void *pvVar1;
  
  if (((it->itype == '\x01') && (pvVar1 = it->funcs, pvVar1 != (void *)0x0)) &&
     ((*(byte *)((long)pvVar1 + 8) & 1) != 0)) {
    return (CRYPTO_refcount_t *)(*pval + *(int *)((long)pvVar1 + 0xc));
  }
  return (CRYPTO_refcount_t *)0x0;
}

Assistant:

static CRYPTO_refcount_t *asn1_get_references(ASN1_VALUE **pval,
                                              const ASN1_ITEM *it) {
  if (it->itype != ASN1_ITYPE_SEQUENCE) {
    return NULL;
  }
  const ASN1_AUX *aux = reinterpret_cast<const ASN1_AUX *>(it->funcs);
  if (!aux || !(aux->flags & ASN1_AFLG_REFCOUNT)) {
    return NULL;
  }
  return reinterpret_cast<CRYPTO_refcount_t *>(
      offset2ptr(*pval, aux->ref_offset));
}